

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O1

void __thiscall DSeqActorNode::MakeSound(DSeqActorNode *this,int loop,FSoundID *id)

{
  AActor *ent;
  float volume;
  float fVar1;
  FSoundID local_4;
  
  ent = (this->m_Actor).field_0.p;
  if ((ent != (AActor *)0x0) && (((ent->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->m_Actor).field_0.p = (AActor *)0x0;
    ent = (AActor *)0x0;
  }
  fVar1 = (this->super_DSeqNode).m_Volume;
  if (1.0 <= fVar1) {
    fVar1 = 1.0;
  }
  volume = 0.0;
  if (0.0 <= fVar1) {
    volume = fVar1;
  }
  S_Sound(ent,loop | 4,&local_4,volume,(this->super_DSeqNode).m_Atten);
  return;
}

Assistant:

void MakeSound(int loop, FSoundID id)
	{
		S_Sound(m_Actor, CHAN_BODY|loop, id, clamp(m_Volume, 0.f, 1.f), m_Atten);
	}